

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_value * sqlite3VdbeGetBoundValue(Vdbe *v,int iVar,u8 aff)

{
  sqlite3 *db;
  int in_ESI;
  long in_RDI;
  sqlite3_value *pRet;
  Mem *pMem;
  sqlite3_value *local_8;
  
  if ((in_RDI == 0) ||
     (db = (sqlite3 *)(*(long *)(in_RDI + 0xa0) + (long)(in_ESI + -1) * 0x38),
     ((ulong)db->pVdbe & 1) != 0)) {
    local_8 = (sqlite3_value *)0x0;
  }
  else {
    local_8 = sqlite3ValueNew(db);
    if (local_8 != (sqlite3_value *)0x0) {
      sqlite3VdbeMemCopy((Mem *)db,local_8);
      sqlite3ValueApplyAffinity
                ((sqlite3_value *)db,(u8)((ulong)local_8 >> 0x38),(u8)((ulong)local_8 >> 0x30));
    }
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE sqlite3_value *sqlite3VdbeGetBoundValue(Vdbe *v, int iVar, u8 aff){
  assert( iVar>0 );
  if( v ){
    Mem *pMem = &v->aVar[iVar-1];
    assert( (v->db->flags & SQLITE_EnableQPSG)==0 );
    if( 0==(pMem->flags & MEM_Null) ){
      sqlite3_value *pRet = sqlite3ValueNew(v->db);
      if( pRet ){
        sqlite3VdbeMemCopy((Mem *)pRet, pMem);
        sqlite3ValueApplyAffinity(pRet, aff, SQLITE_UTF8);
      }
      return pRet;
    }
  }
  return 0;
}